

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O1

void __thiscall
eos::fitting::RenderingParameters::RenderingParameters
          (RenderingParameters *this,ScaledOrthoProjectionParameters *ortho_params,int screen_width,
          int screen_height)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  ScaledOrthoProjectionParameters *pSVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  type mat;
  float fVar10;
  float fVar11;
  
  this->camera_type = Orthographic;
  (this->frustum).l = -1.0;
  (this->frustum).r = 1.0;
  (this->frustum).b = -1.0;
  (this->frustum).t = 1.0;
  this->t_x = ortho_params->tx;
  this->t_y = ortho_params->ty;
  (this->t_z).super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>
  ._M_engaged = false;
  (this->fov_y).super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float>._M_engaged = false;
  this->screen_width = screen_width;
  this->screen_height = screen_height;
  fVar11 = (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
  fVar2 = (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[4];
  fVar3 = (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[8];
  fVar10 = fVar2 + fVar3 + fVar11;
  if (fVar10 <= 0.0) {
    pSVar4 = (ScaledOrthoProjectionParameters *)
             ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array + 3);
    if (fVar2 <= fVar11) {
      pSVar4 = ortho_params;
    }
    pfVar1 = (pSVar4->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array + (fVar11 < fVar2);
    uVar6 = 2;
    if (fVar3 < *pfVar1 || fVar3 == *pfVar1) {
      uVar6 = (ulong)(fVar11 < fVar2);
    }
    lVar8 = 0;
    if (uVar6 + 1 != 3) {
      lVar8 = uVar6 + 1;
    }
    uVar5 = ((lVar8 + 1U) / 3) * -3 + lVar8 + 1;
    fVar11 = (((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[uVar6 * 4] -
              (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[lVar8 * 4]) -
             *(float *)((long)ortho_params + (uVar5 & 0xffffffff) * 4 + uVar5 * 0xc)) + 1.0;
    if (fVar11 < 0.0) {
      fVar11 = sqrtf(fVar11);
    }
    else {
      fVar11 = SQRT(fVar11);
    }
    uVar7 = (ulong)(uint)((int)uVar6 << 2);
    *(float *)((long)(this->rotation).m_coeffs.
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                     array + uVar7) = fVar11 * 0.5;
    fVar11 = 0.5 / fVar11;
    uVar9 = (ulong)(uint)((int)lVar8 << 2);
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] =
         (*(float *)((long)ortho_params + uVar5 * 4 + lVar8 * 0xc) -
         *(float *)((long)ortho_params + uVar9 + uVar5 * 0xc)) * fVar11;
    *(float *)((long)(this->rotation).m_coeffs.
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                     array + uVar9) =
         (*(float *)((long)(ortho_params->R).
                           super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + uVar9 + uVar6 * 0xc) +
         *(float *)((long)(ortho_params->R).
                          super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + uVar7 + lVar8 * 0xc)) * fVar11;
    *(float *)((long)this + uVar5 * 4 + 0x20) =
         (*(float *)((long)ortho_params + uVar5 * 4 + uVar6 * 0xc) +
         *(float *)((long)ortho_params + uVar7 + uVar5 * 0xc)) * fVar11;
  }
  else {
    fVar10 = fVar10 + 1.0;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] = fVar10 * 0.5;
    fVar10 = 0.5 / fVar10;
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] =
         ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[5] -
         (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[7]) * fVar10;
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] =
         ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[6] -
         (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[2]) * fVar10;
    (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] =
         ((ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[1] -
         (ortho_params->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[3]) * fVar10;
  }
  fVar11 = ortho_params->s;
  (this->frustum).l = 0.0;
  (this->frustum).r = (float)screen_width / fVar11;
  (this->frustum).b = 0.0;
  (this->frustum).t = (float)screen_height / fVar11;
  return;
}

Assistant:

RenderingParameters(ScaledOrthoProjectionParameters ortho_params, int screen_width, int screen_height)
        : camera_type(CameraType::Orthographic), t_x(ortho_params.tx), t_y(ortho_params.ty),
          screen_width(screen_width), screen_height(screen_height)
    {
        rotation = ortho_params.R; // converts the rotation matrix to a quaternion

        const float l = 0.0f;
        const float r = screen_width / ortho_params.s;
        const float b = 0.0f; // The b and t values are not tested for what happens if the SOP parameters
        const float t = screen_height / ortho_params.s; // were estimated on a non-flipped viewport.
        frustum = Frustum(l, r, b, t);
    }